

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall piksel::Graphics::background(Graphics *this,vec4 color)

{
  Graphics *this_local;
  vec4 color_local;
  
  push(this);
  fill(this,color);
  noStroke(this);
  rectMode(this,CORNER);
  rect(this,0.0,0.0,(float)*this->framebufferWidth,(float)*this->framebufferHeight);
  pop(this);
  return;
}

Assistant:

void Graphics::background(glm::vec4 color) {
    push();
    fill(color);
    noStroke();
    rectMode(DrawMode::CORNER);
    rect(0.0f, 0.0f, framebufferWidth, framebufferHeight);
    pop();
}